

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_scalar_split(secp256k1_scalar *full)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  secp256k1_context *psVar10;
  int iVar11;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  long lVar12;
  int extraout_EDX;
  undefined8 *extraout_RDX;
  uint uVar13;
  uchar *p2;
  secp256k1_scalar *psVar14;
  secp256k1_ge *ge;
  secp256k1_context *psVar15;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  uint uVar19;
  bool bVar20;
  bool bVar21;
  uchar tmp [32];
  uchar zero [32];
  secp256k1_scalar slam;
  secp256k1_scalar s1;
  secp256k1_scalar s;
  undefined8 uStack_2a0;
  secp256k1_ge *psStack_298;
  size_t sStack_290;
  undefined8 uStack_288;
  undefined8 uStack_280;
  undefined8 uStack_278;
  size_t sStack_270;
  uint uStack_268;
  uint uStack_264;
  undefined1 auStack_260 [104];
  ulong uStack_1f8;
  undefined1 auStack_1f0 [105];
  uint64_t uStack_187;
  uint64_t uStack_17f;
  uint64_t uStack_177;
  secp256k1_ge sStack_160;
  secp256k1_scalar *psStack_f8;
  secp256k1_scalar *psStack_f0;
  byte local_c8 [32];
  byte local_a8 [40];
  secp256k1_scalar local_80;
  secp256k1_scalar local_60;
  secp256k1_scalar local_40;
  
  local_a8[0x10] = 0;
  local_a8[0x11] = 0;
  local_a8[0x12] = 0;
  local_a8[0x13] = 0;
  local_a8[0x14] = 0;
  local_a8[0x15] = 0;
  local_a8[0x16] = 0;
  local_a8[0x17] = 0;
  local_a8[0x18] = 0;
  local_a8[0x19] = 0;
  local_a8[0x1a] = 0;
  local_a8[0x1b] = 0;
  local_a8[0x1c] = 0;
  local_a8[0x1d] = 0;
  local_a8[0x1e] = 0;
  local_a8[0x1f] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[0xc] = 0;
  local_a8[0xd] = 0;
  local_a8[0xe] = 0;
  local_a8[0xf] = 0;
  secp256k1_scalar_split_lambda(&local_60,&local_80,full);
  secp256k1_scalar_mul(&local_40,&secp256k1_const_lambda,&local_80);
  psVar14 = &local_40;
  secp256k1_scalar_add(&local_40,&local_40,&local_60);
  uVar13 = (uint)psVar14;
  secp256k1_scalar_verify(&local_40);
  psVar14 = full;
  secp256k1_scalar_verify(full);
  if ((((local_40.d[0] == full->d[0]) && (local_40.d[1] == full->d[1])) &&
      (local_40.d[2] == full->d[2])) && (local_40.d[3] == full->d[3])) {
    iVar11 = secp256k1_scalar_is_high(&local_60);
    if (iVar11 != 0) {
      secp256k1_scalar_negate(&local_60,&local_60);
    }
    iVar11 = secp256k1_scalar_is_high(&local_80);
    if (iVar11 != 0) {
      secp256k1_scalar_negate(&local_80,&local_80);
    }
    secp256k1_scalar_get_b32(local_c8,&local_60);
    lVar12 = 0;
    uVar16 = extraout_RAX;
    do {
      uVar17 = uVar16 & 0xffffffff;
      bVar18 = local_a8[lVar12];
      uVar13 = (uint)bVar18;
      bVar1 = local_c8[lVar12];
      psVar14 = (secp256k1_scalar *)(ulong)bVar1;
      uVar16 = (ulong)((uint)bVar18 - (uint)bVar1);
      if (bVar18 == bVar1) {
        uVar16 = uVar17;
      }
      iVar11 = (int)uVar16;
      if (bVar18 != bVar1) goto LAB_0015953b;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x10);
    iVar11 = 0;
LAB_0015953b:
    if (iVar11 == 0) {
      secp256k1_scalar_get_b32(local_c8,&local_80);
      lVar12 = 0;
      uVar16 = extraout_RAX_00;
      do {
        uVar17 = uVar16 & 0xffffffff;
        bVar18 = local_a8[lVar12];
        uVar13 = (uint)bVar18;
        bVar1 = local_c8[lVar12];
        psVar14 = (secp256k1_scalar *)(ulong)bVar1;
        uVar16 = (ulong)((uint)bVar18 - (uint)bVar1);
        if (bVar18 == bVar1) {
          uVar16 = uVar17;
        }
        iVar11 = (int)uVar16;
        if (bVar18 != bVar1) goto LAB_00159570;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x10);
      iVar11 = 0;
LAB_00159570:
      if (iVar11 == 0) {
        return;
      }
      goto LAB_0015958d;
    }
  }
  else {
    test_scalar_split_cold_3();
  }
  test_scalar_split_cold_1();
LAB_0015958d:
  test_scalar_split_cold_2();
  auStack_260._80_8_ = 3;
  uStack_268 = uVar13;
  auStack_260._88_4_ = extraout_EDX;
  auStack_260._96_8_ = psVar14;
  psStack_f8 = full;
  psStack_f0 = &local_40;
  do {
    bVar20 = uStack_268 != 0;
    auStack_1f0._65_8_ = psVar14->d[0];
    auStack_1f0._73_8_ = psVar14->d[1];
    auStack_1f0._81_8_ = psVar14->d[2];
    auStack_1f0._89_8_ = psVar14->d[3];
    auStack_1f0._97_8_ = psVar14[1].d[0];
    uStack_187 = psVar14[1].d[1];
    uStack_17f = psVar14[1].d[2];
    uStack_177 = psVar14[1].d[3];
    bVar21 = auStack_260._80_8_ == 0x21;
    auStack_260._92_4_ = (uint)(auStack_260._80_8_ == 0x41) * 4;
    uStack_1f8 = (ulong)(auStack_260._80_8_ == 0x41 || bVar21);
    uVar13 = 0;
    do {
      auStack_1f0[0x40] = (char)uVar13;
      uVar19 = *(byte *)((long)psVar14[1].d + 0x1f) & 1 | 2;
      if ((uStack_268 == 0 || auStack_260._88_4_ == 0) || (uVar13 & 4) != auStack_260._92_4_) {
        bVar18 = 0;
      }
      else {
        bVar18 = ((uVar13 & 0xfb) == uVar19 || uVar13 == 4) & (byte)uStack_1f8;
      }
      psVar15 = CTX;
      if ((((bVar20 && bVar21) && (uVar13 & 0xfe) == 2) | bVar18) != 1) {
        auStack_1f0._48_8_ = 0xfefefefefefefefe;
        auStack_1f0._56_8_ = 0xfefefefefefefefe;
        auStack_1f0._32_8_ = 0xfefefefefefefefe;
        auStack_1f0._40_4_ = -0x1010102;
        auStack_1f0._44_4_ = -0x1010102;
        auStack_1f0._16_8_ = 0xfefefefefefefefe;
        auStack_1f0._24_8_ = 0xfefefefefefefefe;
        auStack_1f0._0_8_ = 0xfefefefefefefefe;
        auStack_1f0._8_8_ = 0xfefefefefefefefe;
        auStack_260._0_8_ = (_func_void_char_ptr_void_ptr *)0x4d430001;
        auStack_260._16_8_ = 0x40;
        auStack_260._24_8_ = 0;
        auStack_260._32_8_ = 0;
        auStack_260._40_4_ = 0;
        auStack_260._44_4_ = 0;
        uStack_2a0 = 0;
        ge = (secp256k1_ge *)auStack_1f0;
        auStack_260._8_8_ = (secp256k1_ge *)auStack_1f0;
        iVar11 = secp256k1_ec_pubkey_parse
                           (CTX,(secp256k1_pubkey *)auStack_1f0,auStack_1f0 + 0x40,
                            auStack_260._80_8_);
        psVar10 = CTX;
        if (iVar11 != 0) {
          ec_pubkey_parse_pointtest_cold_1();
          goto LAB_00159ce4;
        }
        auStack_260._16_8_ = 0x40;
        auStack_260._24_8_ = 0;
        auStack_260._32_8_ = 0;
        auStack_260._40_4_ = 0;
        auStack_260._44_4_ = 0;
        uStack_2a0 = 0;
        auStack_260._0_8_ = (CTX->illegal_callback).fn;
        auStack_260._8_8_ = (CTX->illegal_callback).data;
        if (CTX == &secp256k1_context_static_) {
          secp256k1_default_illegal_callback_fn("ctx != secp256k1_context_static",(void *)0x0);
        }
        else {
          (CTX->illegal_callback).fn = counting_callback_fn;
          (psVar10->illegal_callback).data = &uStack_2a0;
        }
        ge = &sStack_160;
        psVar15 = CTX;
        iVar11 = secp256k1_pubkey_load(CTX,ge,(secp256k1_pubkey *)auStack_1f0);
        psVar10 = CTX;
        if (iVar11 != 0) goto LAB_00159cee;
        (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)auStack_260._0_8_;
        (psVar10->illegal_callback).data = (void *)auStack_260._8_8_;
        if ((int)uStack_2a0 == 1) goto LAB_00159c9a;
LAB_00159cf3:
        ec_pubkey_parse_pointtest_cold_3();
LAB_00159cf8:
        ec_pubkey_parse_pointtest_cold_4();
LAB_00159cfd:
        ec_pubkey_parse_pointtest_cold_5();
LAB_00159d02:
        ec_pubkey_parse_pointtest_cold_12();
LAB_00159d07:
        ec_pubkey_parse_pointtest_cold_6();
LAB_00159d0c:
        ec_pubkey_parse_pointtest_cold_11();
LAB_00159d11:
        ec_pubkey_parse_pointtest_cold_10();
LAB_00159d16:
        ec_pubkey_parse_pointtest_cold_7();
LAB_00159d1b:
        ec_pubkey_parse_pointtest_cold_8();
LAB_00159d20:
        ec_pubkey_parse_pointtest_cold_9();
        *(undefined1 *)&(psVar15->ecmult_gen_ctx).built = 4;
        uVar4 = (ge->x).n[1];
        uVar5 = (ge->x).n[2];
        uVar6 = (ge->x).n[3];
        *(uint64_t *)((long)&(psVar15->ecmult_gen_ctx).built + 1) = (ge->x).n[0];
        *(uint64_t *)((long)(psVar15->ecmult_gen_ctx).scalar_offset.d + 1) = uVar4;
        *(uint64_t *)((long)(psVar15->ecmult_gen_ctx).scalar_offset.d + 9) = uVar5;
        *(uint64_t *)((long)(psVar15->ecmult_gen_ctx).scalar_offset.d + 0x11) = uVar6;
        uVar7 = extraout_RDX[1];
        uVar8 = extraout_RDX[2];
        uVar9 = extraout_RDX[3];
        *(undefined8 *)((long)(psVar15->ecmult_gen_ctx).scalar_offset.d + 0x19) = *extraout_RDX;
        *(undefined8 *)((long)(psVar15->ecmult_gen_ctx).ge_offset.x.n + 1) = uVar7;
        *(undefined8 *)((long)(psVar15->ecmult_gen_ctx).ge_offset.x.n + 9) = uVar8;
        *(undefined8 *)((long)(psVar15->ecmult_gen_ctx).ge_offset.x.n + 0x11) = uVar9;
        return;
      }
      auStack_1f0._0_8_ = 0;
      auStack_1f0._8_8_ = 0;
      auStack_1f0._16_8_ = 0;
      auStack_1f0._24_8_ = 0;
      auStack_1f0._32_8_ = 0;
      auStack_1f0._40_4_ = 0;
      auStack_1f0._44_4_ = 0;
      auStack_1f0._48_8_ = 0;
      auStack_1f0._56_8_ = 0;
      auStack_260._0_8_ = (_func_void_char_ptr_void_ptr *)0x4d430001;
      auStack_260._16_8_ = 0x40;
      auStack_260._24_8_ = 0;
      auStack_260._32_8_ = 0;
      auStack_260._40_4_ = 0;
      auStack_260._44_4_ = 0;
      uStack_2a0 = 0;
      ge = (secp256k1_ge *)auStack_1f0;
      auStack_260._8_8_ = (secp256k1_ge *)auStack_1f0;
      iVar11 = secp256k1_ec_pubkey_parse
                         (CTX,(secp256k1_pubkey *)auStack_1f0,auStack_1f0 + 0x40,auStack_260._80_8_)
      ;
      if (iVar11 == 0) {
LAB_00159ce4:
        ec_pubkey_parse_pointtest_cold_14();
LAB_00159ce9:
        ec_pubkey_parse_pointtest_cold_13();
LAB_00159cee:
        ec_pubkey_parse_pointtest_cold_2();
        goto LAB_00159cf3;
      }
      auStack_260._0_8_ = (_func_void_char_ptr_void_ptr *)0x4d430005;
      auStack_260._16_8_ = 0x40;
      auStack_260._24_8_ = 0;
      auStack_260._32_8_ = 0;
      auStack_260._40_4_ = 0;
      auStack_260._44_4_ = 0;
      sStack_270 = 0x41;
      uStack_2a0 = 0x4d430001;
      sStack_290 = 0x41;
      uStack_288 = 0;
      uStack_280 = 0;
      uStack_278 = 0;
      uVar16 = 0x102;
      ge = (secp256k1_ge *)auStack_260;
      psVar15 = CTX;
      psStack_298 = (secp256k1_ge *)auStack_260;
      uStack_264 = uVar13;
      auStack_260._8_8_ = (secp256k1_ge *)auStack_1f0;
      iVar11 = secp256k1_ec_pubkey_serialize
                         (CTX,(uchar *)auStack_260,&sStack_270,(secp256k1_pubkey *)auStack_1f0,0x102
                         );
      psVar14 = (secp256k1_scalar *)auStack_260._96_8_;
      if (iVar11 == 0) goto LAB_00159ce9;
      uStack_2a0 = 0x4d430005;
      sStack_290 = sStack_270;
      uStack_288 = 0;
      uStack_280 = 0;
      uStack_278 = 0;
      uVar17 = (ulong)((long)psVar15 << 3) >> 0x33;
      uVar3 = (((long)psVar15 << 3 | (ulong)psVar15 >> 0x3d) << 0xd | uVar17) >> 3;
      psVar15 = (secp256k1_context *)(uVar3 << 0x33 | (uVar17 << 0x3d | uVar3) >> 0xd);
      psStack_298 = (secp256k1_ge *)auStack_260;
      if (sStack_270 != 0x21) goto LAB_00159cf8;
      lVar12 = 1;
      do {
        bVar1 = auStack_260[lVar12];
        ge = (secp256k1_ge *)(ulong)bVar1;
        bVar2 = auStack_1f0[lVar12 + 0x40];
        psVar15 = (secp256k1_context *)(ulong)bVar2;
        uVar17 = (ulong)((uint)bVar1 - (uint)bVar2);
        if (bVar1 == bVar2) {
          uVar17 = uVar16 & 0xffffffff;
        }
        iVar11 = (int)uVar17;
        if (bVar1 != bVar2) goto LAB_00159904;
        lVar12 = lVar12 + 1;
        uVar16 = uVar17;
      } while (lVar12 != 0x21);
      iVar11 = 0;
LAB_00159904:
      if (iVar11 != 0) goto LAB_00159cfd;
      if ((auStack_260._80_8_ == 0x21) && (auStack_260[0] != auStack_1f0[0x40])) goto LAB_00159d02;
      uVar13 = uStack_264;
      if (bVar18 != 0) {
        if (auStack_260[0] != (char)uVar19) goto LAB_00159d07;
        ge = &sStack_160;
        psVar15 = CTX;
        iVar11 = secp256k1_pubkey_load(CTX,&sStack_160,(secp256k1_pubkey *)auStack_1f0);
        if (iVar11 == 0) goto LAB_00159d0c;
        auStack_1f0._48_8_ = 0;
        auStack_1f0._56_8_ = 0;
        auStack_1f0._32_8_ = 0;
        auStack_1f0._40_4_ = 0;
        auStack_1f0._44_4_ = 0;
        auStack_1f0._16_8_ = 0;
        auStack_1f0._24_8_ = 0;
        auStack_1f0._0_8_ = 0;
        auStack_1f0._8_8_ = 0;
        uStack_2a0 = 0x4d430001;
        sStack_290 = 0x40;
        uStack_288 = 0;
        uStack_280 = 0;
        uStack_278 = 0;
        psStack_298 = (secp256k1_ge *)auStack_1f0;
        secp256k1_ge_to_bytes((uchar *)auStack_1f0,&sStack_160);
        sStack_270 = 0x41;
        uStack_2a0 = 0x4d430001;
        sStack_290 = 0x41;
        uStack_288 = 0;
        uStack_280 = 0;
        uStack_278 = 0;
        ge = (secp256k1_ge *)auStack_260;
        psVar15 = CTX;
        psStack_298 = (secp256k1_ge *)auStack_260;
        iVar11 = secp256k1_ec_pubkey_serialize
                           (CTX,(uchar *)auStack_260,&sStack_270,(secp256k1_pubkey *)auStack_1f0,2);
        if (iVar11 == 0) goto LAB_00159d11;
        uStack_2a0 = 0x4d430005;
        sStack_290 = sStack_270;
        uStack_288 = 0;
        uStack_280 = 0;
        uStack_278 = 0;
        uVar16 = (ulong)((long)psVar15 << 3) >> 0x33;
        uVar17 = (((long)psVar15 << 3 | (ulong)psVar15 >> 0x3d) << 0xd | uVar16) >> 3;
        psVar15 = (secp256k1_context *)(uVar17 << 0x33 | (uVar16 << 0x3d | uVar17) >> 0xd);
        psStack_298 = (secp256k1_ge *)auStack_260;
        if (sStack_270 != 0x41) goto LAB_00159d16;
        if (auStack_260[0] == '\x04') {
          lVar12 = 0;
          do {
            bVar18 = auStack_260[lVar12 + 1];
            ge = (secp256k1_ge *)(ulong)bVar18;
            bVar1 = *(byte *)((long)psVar14->d + lVar12);
            psVar15 = (secp256k1_context *)(ulong)bVar1;
            iVar11 = (uint)bVar18 - (uint)bVar1;
            if (bVar18 != bVar1) goto LAB_00159b2c;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 0x40);
          iVar11 = 0;
LAB_00159b2c:
          uVar13 = uStack_264;
          if (iVar11 != 0) goto LAB_00159d20;
          goto LAB_00159c9a;
        }
        goto LAB_00159d1b;
      }
LAB_00159c9a:
      uVar13 = uVar13 + 1;
    } while (uVar13 != 0x100);
    auStack_260._80_8_ = auStack_260._80_8_ + 1;
    if (auStack_260._80_8_ == 0x42) {
      return;
    }
  } while( true );
}

Assistant:

static void test_scalar_split(const secp256k1_scalar* full) {
    secp256k1_scalar s, s1, slam;
    const unsigned char zero[32] = {0};
    unsigned char tmp[32];

    secp256k1_scalar_split_lambda(&s1, &slam, full);

    /* check slam*lambda + s1 == full */
    secp256k1_scalar_mul(&s, &secp256k1_const_lambda, &slam);
    secp256k1_scalar_add(&s, &s, &s1);
    CHECK(secp256k1_scalar_eq(&s, full));

    /* check that both are <= 128 bits in size */
    if (secp256k1_scalar_is_high(&s1)) {
        secp256k1_scalar_negate(&s1, &s1);
    }
    if (secp256k1_scalar_is_high(&slam)) {
        secp256k1_scalar_negate(&slam, &slam);
    }

    secp256k1_scalar_get_b32(tmp, &s1);
    CHECK(secp256k1_memcmp_var(zero, tmp, 16) == 0);
    secp256k1_scalar_get_b32(tmp, &slam);
    CHECK(secp256k1_memcmp_var(zero, tmp, 16) == 0);
}